

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_deserializer.cpp
# Opt level: O0

void __thiscall
miniros::MessageDeserializer::MessageDeserializer
          (MessageDeserializer *this,SubscriptionCallbackHelperPtr *helper,SerializedMessage *m,
          shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *connection_header)

{
  bool bVar1;
  element_type *peVar2;
  long in_RDI;
  __shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2> *this_00;
  SerializedMessage *in_stack_ffffffffffffff98;
  SerializedMessage *in_stack_ffffffffffffffa0;
  type_info *this_01;
  
  std::shared_ptr<miniros::SubscriptionCallbackHelper>::shared_ptr
            ((shared_ptr<miniros::SubscriptionCallbackHelper> *)in_stack_ffffffffffffffa0,
             (shared_ptr<miniros::SubscriptionCallbackHelper> *)in_stack_ffffffffffffff98);
  this_00 = (__shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 0x10);
  SerializedMessage::SerializedMessage(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::shared_ptr((shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)in_stack_ffffffffffffffa0,
               (shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)in_stack_ffffffffffffff98);
  std::mutex::mutex((mutex *)0x47067a);
  std::shared_ptr<const_void>::shared_ptr((shared_ptr<const_void> *)0x470690);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x30));
  if (bVar1) {
    this_01 = *(type_info **)(in_RDI + 0x40);
    peVar2 = std::
             __shared_ptr_access<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4706c3);
    (*peVar2->_vptr_SubscriptionCallbackHelper[4])();
    bVar1 = std::type_info::operator!=(this_01,(type_info *)in_stack_ffffffffffffff98);
    if (bVar1) {
      std::__shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>::reset(this_00);
    }
  }
  return;
}

Assistant:

MessageDeserializer::MessageDeserializer(const SubscriptionCallbackHelperPtr& helper, const SerializedMessage& m, const std::shared_ptr<M_string>& connection_header)
: helper_(helper)
, serialized_message_(m)
, connection_header_(connection_header)
{
  if (serialized_message_.message && *serialized_message_.type_info != helper->getTypeInfo())
  {
    serialized_message_.message.reset();
  }
}